

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::DeadBranchElimPass::GetConstCondition
          (DeadBranchElimPass *this,uint32_t condId,bool *condVal)

{
  Op OVar1;
  IRContext *this_00;
  bool bVar2;
  uint32_t uVar3;
  undefined8 in_RAX;
  Instruction *this_01;
  bool negVal;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  this_00 = (this->super_MemPass).super_Pass.context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  this_01 = analysis::DefUseManager::GetDef
                      ((this_00->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,condId);
  OVar1 = this_01->opcode_;
  if ((int)OVar1 < 0x2e) {
    if (OVar1 == OpConstantTrue) {
      *condVal = true;
      return true;
    }
    if (OVar1 != OpConstantFalse) {
      return false;
    }
  }
  else {
    if (OVar1 == OpLogicalNot) {
      uVar3 = (this_01->has_result_id_ & 1) + 1;
      if (this_01->has_type_id_ == false) {
        uVar3 = (uint)this_01->has_result_id_;
      }
      uVar3 = Instruction::GetSingleWordOperand(this_01,uVar3);
      bVar2 = GetConstCondition(this,uVar3,&local_21);
      if (bVar2) {
        *condVal = (bool)(local_21 ^ 1);
        return bVar2;
      }
      return bVar2;
    }
    if (OVar1 != OpConstantNull) {
      return false;
    }
  }
  *condVal = false;
  return true;
}

Assistant:

bool DeadBranchElimPass::GetConstCondition(uint32_t condId, bool* condVal) {
  bool condIsConst;
  Instruction* cInst = get_def_use_mgr()->GetDef(condId);
  switch (cInst->opcode()) {
    case spv::Op::OpConstantNull:
    case spv::Op::OpConstantFalse: {
      *condVal = false;
      condIsConst = true;
    } break;
    case spv::Op::OpConstantTrue: {
      *condVal = true;
      condIsConst = true;
    } break;
    case spv::Op::OpLogicalNot: {
      bool negVal;
      condIsConst =
          GetConstCondition(cInst->GetSingleWordInOperand(0), &negVal);
      if (condIsConst) *condVal = !negVal;
    } break;
    default: { condIsConst = false; } break;
  }
  return condIsConst;
}